

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O2

int __thiscall sector_t::FindMinSurroundingLight(sector_t *this,int min)

{
  sector_t_conflict *psVar1;
  int i;
  long lVar2;
  
  for (lVar2 = 0; lVar2 < this->linecount; lVar2 = lVar2 + 1) {
    psVar1 = getNextSector(this->lines[lVar2],(sector_t_conflict *)this);
    if ((psVar1 != (sector_t_conflict *)0x0) && (psVar1->lightlevel <= min)) {
      min = (int)psVar1->lightlevel;
    }
  }
  return min;
}

Assistant:

int sector_t::FindMinSurroundingLight (int min) const
{
	int 		i;
	line_t* 	line;
	sector_t*	check;
		
	for (i = 0; i < linecount; i++)
	{
		line = lines[i];
		if (NULL != (check = getNextSector (line, this)) &&
			check->lightlevel < min)
		{
			min = check->lightlevel;
		}
	}
	return min;
}